

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O2

void vbytefse::decode(uint8_t *in_ptr,size_t in_size_u8,uint32_t *out_ptr,size_t out_size_u32,
                     uint8_t *buf)

{
  size_t dstCapacity;
  uint8_t *in_ptr_00;
  
  dstCapacity = (size_t)*(uint *)in_ptr;
  in_ptr_00 = in_ptr + 4;
  if (dstCapacity == 0) {
    dstCapacity = in_size_u8 - 4;
  }
  else {
    FSE_decompress(buf,dstCapacity,in_ptr_00,in_size_u8 - 4);
    in_ptr_00 = buf;
  }
  vbyte::decode(in_ptr_00,dstCapacity,out_ptr,out_size_u32,(uint8_t *)0x0);
  return;
}

Assistant:

static void decode(const uint8_t* in_ptr, size_t in_size_u8,
        uint32_t* out_ptr, size_t out_size_u32, uint8_t* buf = NULL)
    {
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
        size_t vbyte_bytes = *in_ptr_u32;
        in_ptr += +sizeof(uint32_t);
        if (vbyte_bytes == 0) {
            vbyte::decode(
                in_ptr, in_size_u8 - sizeof(uint32_t), out_ptr, out_size_u32);
        } else {
            FSE_decompress(
                buf, vbyte_bytes, in_ptr, in_size_u8 - sizeof(uint32_t));
            vbyte::decode(buf, vbyte_bytes, out_ptr, out_size_u32);
        }
    }